

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lys_compile_node_list(lysc_ctx *ctx,lysp_node *pnode,lysc_node *node)

{
  lys_module *plVar1;
  LY_ERR LVar2;
  ushort **ppuVar3;
  lysc_node *plVar4;
  long local_120;
  lysp_ext_instance *local_100;
  lysp_ext_instance *local_f0;
  lysp_ext_instance *local_d8;
  lysp_ext_instance *local_c8;
  long local_a8;
  long local_a0;
  undefined4 local_94;
  LY_ERR ret___2;
  LY_ERR ret___1;
  char *p__;
  uint64_t __u;
  LY_ERR ret__;
  LY_ERR ret;
  char *delim;
  char *keystr;
  size_t len;
  lysc_node_leaf *prev_key;
  lysc_node_leaf *key;
  lysc_node *parent;
  lysp_node *child_p;
  lysc_node_list *list;
  lysp_node_list *list_p;
  lysc_node *node_local;
  lysp_node *pnode_local;
  lysc_ctx *ctx_local;
  
  len = 0;
  *(undefined4 *)&node[1].dsc = *(undefined4 *)&pnode[2].nodetype;
  if (*(int *)&node[1].dsc != 0) {
    node->flags = node->flags | 0x20;
  }
  if (*(int *)&pnode[2].field_0xc == 0) {
    local_94 = 0xffffffff;
  }
  else {
    local_94 = *(undefined4 *)&pnode[2].field_0xc;
  }
  *(undefined4 *)((long)&node[1].dsc + 4) = local_94;
  for (parent = (lysc_node *)pnode[1].ref; parent != (lysc_node *)0x0; parent = parent->parent) {
    LVar2 = lys_compile_node(ctx,(lysp_node *)parent,node,0,(ly_set *)0x0);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
  }
  if (pnode[1].parent == (lysp_node *)0x0) {
LAB_00174198:
    __u._4_4_ = lysc_unres_must_add(ctx,node,pnode);
    if (__u._4_4_ == LY_SUCCESS) {
      if ((node->flags & 1) != 0) {
        key = (lysc_node_leaf *)node;
        if ((ctx->compile_opts & 1) != 0) {
          while ((key != (lysc_node_leaf *)0x0 && (((key->field_0).node.flags & 0x800) == 0))) {
            key = (lysc_node_leaf *)(key->field_0).node.parent;
          }
        }
        if ((key != (lysc_node_leaf *)0x0) &&
           ((pnode[1].next == (lysp_node *)0x0 || (*(char *)&(pnode[1].next)->parent == '\0')))) {
          ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                  "Missing key in list representing configuration data.");
          return LY_EVALID;
        }
      }
      delim = (char *)pnode[1].next;
      if ((lysp_node *)delim == (lysp_node *)0x0) {
        node->flags = node->flags & 0xff7f;
        node->flags = node->flags | 0x240;
      }
      while (delim != (char *)0x0) {
        _ret__ = strpbrk(delim," \t\n");
        if (_ret__ == (char *)0x0) {
          keystr = (char *)strlen(delim);
        }
        else {
          keystr = _ret__ + -(long)delim;
          while (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*_ret__] & 0x2000) != 0) {
            _ret__ = _ret__ + 1;
          }
        }
        plVar4 = lys_find_child(node,node->module,delim,(size_t)keystr,4,2);
        if (plVar4 == (lysc_node *)0x0) {
          ly_vlog(ctx->ctx,(char *)0x0,LYVE_REFERENCE,"The list\'s key \"%.*s\" not found.",
                  (ulong)keystr & 0xffffffff,delim);
          return LY_EVALID;
        }
        if ((plVar4->flags & 0x100) != 0) {
          ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,"Duplicated key identifier \"%.*s\".",
                  (ulong)keystr & 0xffffffff,delim);
          return LY_EVALID;
        }
        lysc_update_path(ctx,node->module,plVar4->name);
        if ((node->flags & 3) != (plVar4->flags & 3)) {
          ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                  "Key of a configuration list must not be a state leaf.");
          return LY_EVALID;
        }
        if (ctx->pmod->version < 2) {
          if (*(int *)&(plVar4[1].parent)->next == 10) {
            ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                    "List key of the \"empty\" type is allowed only in YANG 1.1 modules.");
            return LY_EVALID;
          }
        }
        else if (plVar4[1].module != (lys_module *)0x0) {
          ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                  "List\'s key must not have any \"when\" statement.");
          return LY_EVALID;
        }
        LVar2 = lysc_check_status(ctx,node->flags,node->module,node->name,plVar4->flags,
                                  plVar4->module,plVar4->name);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        if (plVar4[1].prev != (lysc_node *)0x0) {
          (**(code **)((plVar4[1].prev)->module->revision + 0x38))(ctx->ctx,plVar4[1].prev);
          lysc_type_free(&ctx->free_ctx,(lysc_type *)(plVar4[1].prev)->module);
          free(plVar4[1].prev);
          plVar4[1].prev = (lysc_node *)0x0;
        }
        plVar4->flags = plVar4->flags | 0x100;
        if (((len != 0) && ((lysc_node *)len != plVar4->prev)) ||
           ((len == 0 && (plVar4->prev->next != (lysc_node *)0x0)))) {
          if (plVar4->next == (lysc_node *)0x0) {
            *(lysc_node **)(*(long *)(node + 1) + 0x20) = plVar4->prev;
          }
          else {
            plVar4->next->prev = plVar4->prev;
          }
          if (plVar4->prev->next != (lysc_node *)0x0) {
            plVar4->prev->next = plVar4->next;
          }
          if (len == 0) {
            plVar4->prev = *(lysc_node **)(*(long *)(node + 1) + 0x20);
            plVar4->next = *(lysc_node **)(node + 1);
            *(lysc_node **)(*(long *)(node + 1) + 0x20) = plVar4;
          }
          else {
            plVar4->prev = (lysc_node *)len;
            plVar4->next = *(lysc_node **)(len + 0x18);
            if (*(long *)(len + 0x18) == 0) {
              *(lysc_node **)(*(long *)(node + 1) + 0x20) = plVar4;
            }
            else {
              *(lysc_node **)(*(long *)(len + 0x18) + 0x20) = plVar4;
            }
            *(lysc_node **)(len + 0x18) = plVar4;
          }
          if (plVar4->prev->next == (lysc_node *)0x0) {
            *(lysc_node **)(node + 1) = plVar4;
          }
        }
        delim = _ret__;
        lysc_update_path(ctx,(lys_module *)0x0,(char *)0x0);
        len = (size_t)plVar4;
      }
      __u._4_4_ = lys_compile_node_augments(ctx,node);
      if (__u._4_4_ == LY_SUCCESS) {
        if ((pnode[2].parent != (lysp_node *)0x0) &&
           (LVar2 = lys_compile_node_list_unique
                              (ctx,(lysp_qname *)pnode[2].parent,(lysc_node_list *)node),
           LVar2 != LY_SUCCESS)) {
          return LVar2;
        }
        for (parent = (lysc_node *)pnode[1].iffeatures; parent != (lysc_node *)0x0;
            parent = parent->parent) {
          LVar2 = lys_compile_node(ctx,(lysp_node *)parent,node,0,(ly_set *)0x0);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          __u._4_4_ = LY_SUCCESS;
        }
        for (parent = (lysc_node *)pnode[1].exts; parent != (lysc_node *)0x0;
            parent = parent->parent) {
          LVar2 = lys_compile_node(ctx,(lysp_node *)parent,node,0,(ly_set *)0x0);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          __u._4_4_ = LY_SUCCESS;
        }
        if (*(uint *)((long)&node[1].dsc + 4) < *(uint *)&node[1].dsc) {
          ly_vlog(ctx->ctx,(char *)0x0,LYVE_SEMANTICS,
                  "List min-elements %u is bigger than max-elements %u.",
                  (ulong)*(uint *)&node[1].dsc,(ulong)*(uint *)((long)&node[1].dsc + 4));
          return LY_EVALID;
        }
      }
    }
  }
  else {
    if (node[1].module == (lys_module *)0x0) {
      local_a8 = 0;
    }
    else {
      if (node[1].module == (lys_module *)0x0) {
        local_a0 = 0;
      }
      else {
        plVar1 = node[1].module;
        local_a0._0_1_ = plVar1[-1].implemented;
        local_a0._1_1_ = plVar1[-1].to_compile;
        local_a0._2_1_ = plVar1[-1].latest_revision;
        local_a0._3_5_ = *(undefined5 *)&plVar1[-1].field_0x7b;
      }
      local_a8 = local_a0;
    }
    if (node[1].module == (lys_module *)0x0) {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_d8 = (lysp_ext_instance *)0x0;
      }
      else {
        local_d8 = pnode[1].parent[-1].exts;
      }
      _ret___2 = (long *)calloc(1,((long)&local_d8->name + local_a8) * 0x38 + 8);
      if (_ret___2 == (long *)0x0) {
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node_list")
        ;
        return LY_EMEM;
      }
    }
    else {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_c8 = (lysp_ext_instance *)0x0;
      }
      else {
        local_c8 = pnode[1].parent[-1].exts;
      }
      _ret___2 = (long *)realloc(&node[1].module[-1].implemented,
                                 ((long)&local_c8->name +
                                 *(long *)&node[1].module[-1].implemented + local_a8) * 0x38 + 8);
      if (_ret___2 == (long *)0x0) {
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_node_list")
        ;
        return LY_EMEM;
      }
    }
    node[1].module = (lys_module *)(_ret___2 + 1);
    if (node[1].module != (lys_module *)0x0) {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_f0 = (lysp_ext_instance *)0x0;
      }
      else {
        local_f0 = pnode[1].parent[-1].exts;
      }
      memset(&(node[1].module)->ctx + *_ret___2 * 7,0,((long)&local_f0->name + local_a8) * 0x38);
    }
    p__ = (char *)0x0;
    while( true ) {
      if (pnode[1].parent == (lysp_node *)0x0) {
        local_100 = (lysp_ext_instance *)0x0;
      }
      else {
        local_100 = pnode[1].parent[-1].exts;
      }
      if (local_100 <= p__) goto LAB_00174198;
      *(long *)&node[1].module[-1].implemented = *(long *)&node[1].module[-1].implemented + 1;
      if (node[1].module == (lys_module *)0x0) {
        local_120 = 0;
      }
      else {
        plVar1 = node[1].module;
        local_120._0_1_ = plVar1[-1].implemented;
        local_120._1_1_ = plVar1[-1].to_compile;
        local_120._2_1_ = plVar1[-1].latest_revision;
        local_120._3_5_ = *(undefined5 *)&plVar1[-1].field_0x7b;
      }
      __u._4_4_ = lys_compile_must(ctx,(lysp_restr *)(pnode[1].parent + (long)p__),
                                   (lysc_must *)((long)node[1].module + (local_120 + -1) * 0x38));
      if (__u._4_4_ != LY_SUCCESS) break;
      p__ = p__ + 1;
    }
  }
  return __u._4_4_;
}

Assistant:

static LY_ERR
lys_compile_node_list(struct lysc_ctx *ctx, struct lysp_node *pnode, struct lysc_node *node)
{
    struct lysp_node_list *list_p = (struct lysp_node_list *)pnode;
    struct lysc_node_list *list = (struct lysc_node_list *)node;
    struct lysp_node *child_p;
    struct lysc_node *parent;
    struct lysc_node_leaf *key, *prev_key = NULL;
    size_t len;
    const char *keystr, *delim;
    LY_ERR ret = LY_SUCCESS;

    list->min = list_p->min;
    if (list->min) {
        list->flags |= LYS_MAND_TRUE;
    }
    list->max = list_p->max ? list_p->max : UINT32_MAX;

    LY_LIST_FOR(list_p->child, child_p) {
        LY_CHECK_RET(lys_compile_node(ctx, child_p, node, 0, NULL));
    }

    COMPILE_ARRAY_GOTO(ctx, list_p->musts, list->musts, lys_compile_must, ret, done);

    /* add must(s) to unres */
    ret = lysc_unres_must_add(ctx, node, pnode);
    LY_CHECK_GOTO(ret, done);

    /* keys */
    if (list->flags & LYS_CONFIG_W) {
        parent = node;
        if (ctx->compile_opts & LYS_COMPILE_GROUPING) {
            /* compiling individual grouping, we can check this only if there is an explicit config set */
            while (parent) {
                if (parent->flags & LYS_SET_CONFIG) {
                    break;
                }
                parent = parent->parent;
            }
        }

        if (parent && (!list_p->key || !list_p->key[0])) {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Missing key in list representing configuration data.");
            return LY_EVALID;
        }
    }

    /* find all the keys (must be direct children) */
    keystr = list_p->key;
    if (!keystr) {
        /* keyless list */
        list->flags &= ~LYS_ORDBY_SYSTEM;
        list->flags |= LYS_KEYLESS | LYS_ORDBY_USER;
    }
    while (keystr) {
        delim = strpbrk(keystr, " \t\n");
        if (delim) {
            len = delim - keystr;
            while (isspace(*delim)) {
                ++delim;
            }
        } else {
            len = strlen(keystr);
        }

        /* key node must be present */
        key = (struct lysc_node_leaf *)lys_find_child(node, node->module, keystr, len, LYS_LEAF, LYS_GETNEXT_NOCHOICE);
        if (!key) {
            LOGVAL(ctx->ctx, LYVE_REFERENCE, "The list's key \"%.*s\" not found.", (int)len, keystr);
            return LY_EVALID;
        }
        /* keys must be unique */
        if (key->flags & LYS_KEY) {
            /* the node was already marked as a key */
            LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Duplicated key identifier \"%.*s\".", (int)len, keystr);
            return LY_EVALID;
        }

        lysc_update_path(ctx, list->module, key->name);
        /* key must have the same config flag as the list itself */
        if ((list->flags & LYS_CONFIG_MASK) != (key->flags & LYS_CONFIG_MASK)) {
            LOGVAL(ctx->ctx, LYVE_SEMANTICS, "Key of a configuration list must not be a state leaf.");
            return LY_EVALID;
        }
        if (ctx->pmod->version < LYS_VERSION_1_1) {
            /* YANG 1.0 denies key to be of empty type */
            if (key->type->basetype == LY_TYPE_EMPTY) {
                LOGVAL(ctx->ctx, LYVE_SEMANTICS,
                        "List key of the \"empty\" type is allowed only in YANG 1.1 modules.");
                return LY_EVALID;
            }
        } else {
            /* when and if-feature are illegal on list keys */
            if (key->when) {
                LOGVAL(ctx->ctx, LYVE_SEMANTICS, "List's key must not have any \"when\" statement.");
                return LY_EVALID;
            }
            /* unable to check if-features but compilation would fail if disabled */
        }

        /* check status */
        LY_CHECK_RET(lysc_check_status(ctx, list->flags, list->module, list->name, key->flags, key->module, key->name));

        /* ignore default values of the key */
        if (key->dflt) {
            key->dflt->realtype->plugin->free(ctx->ctx, key->dflt);
            lysc_type_free(&ctx->free_ctx, (struct lysc_type *)key->dflt->realtype);
            free(key->dflt);
            key->dflt = NULL;
        }
        /* mark leaf as key */
        key->flags |= LYS_KEY;

        /* move it to the correct position */
        if ((prev_key && ((struct lysc_node *)prev_key != key->prev)) || (!prev_key && key->prev->next)) {
            /* fix links in closest previous siblings of the key */
            if (key->next) {
                key->next->prev = key->prev;
            } else {
                /* last child */
                list->child->prev = key->prev;
            }
            if (key->prev->next) {
                key->prev->next = key->next;
            }
            /* fix links in the key */
            if (prev_key) {
                key->prev = &prev_key->node;
                key->next = prev_key->next;
            } else {
                key->prev = list->child->prev;
                key->next = list->child;
            }
            /* fix links in closes future siblings of the key */
            if (prev_key) {
                if (prev_key->next) {
                    prev_key->next->prev = &key->node;
                } else {
                    list->child->prev = &key->node;
                }
                prev_key->next = &key->node;
            } else {
                list->child->prev = &key->node;
            }
            /* fix links in parent */
            if (!key->prev->next) {
                list->child = &key->node;
            }
        }

        /* next key value */
        prev_key = key;
        keystr = delim;
        lysc_update_path(ctx, NULL, NULL);
    }

    /* connect any augments */
    LY_CHECK_GOTO(ret = lys_compile_node_augments(ctx, node), done);

    /* uniques */
    if (list_p->uniques) {
        LY_CHECK_RET(lys_compile_node_list_unique(ctx, list_p->uniques, list));
    }

    LY_LIST_FOR((struct lysp_node *)list_p->actions, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }
    LY_LIST_FOR((struct lysp_node *)list_p->notifs, child_p) {
        ret = lys_compile_node(ctx, child_p, node, 0, NULL);
        LY_CHECK_GOTO(ret, done);
    }

    /* checks */
    if (list->min > list->max) {
        LOGVAL(ctx->ctx, LYVE_SEMANTICS, "List min-elements %" PRIu32 " is bigger than max-elements %" PRIu32 ".",
                list->min, list->max);
        return LY_EVALID;
    }

done:
    return ret;
}